

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Trivia __thiscall
slang::parsing::Preprocessor::handleDefaultDecayTimeDirective(Preprocessor *this,Token directive)

{
  bool bVar1;
  TokenKind TVar2;
  DefaultDecayTimeDirectiveSyntax *syntax;
  Token TVar3;
  string_view __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  Token local_48;
  Token directive_local;
  Token local_28;
  Trivia local_18;
  
  directive_local.info = directive.info;
  directive_local._0_8_ = directive._0_8_;
  checkOutsideDesignElement(this,directive);
  Token::Token(&local_48);
  TVar3 = peek(this);
  TVar2 = TVar3.kind;
  if ((TVar2 != RealLiteral) && (TVar2 != IntegerLiteral)) {
    if (TVar2 != Identifier) goto LAB_0058536d;
    local_28 = peek(this);
    __x = Token::valueText(&local_28);
    __y._M_str = "infinite";
    __y._M_len = 8;
    bVar1 = std::operator==(__x,__y);
    if (!bVar1) goto LAB_0058536d;
  }
  local_48 = consume(this);
LAB_0058536d:
  if (local_48.info == (Info *)0x0) {
    local_48 = expect(this,IntegerLiteral);
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::DefaultDecayTimeDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&directive_local,&local_48);
  Trivia::Trivia(&local_18,Directive,(SyntaxNode *)syntax);
  return local_18;
}

Assistant:

Trivia Preprocessor::handleDefaultDecayTimeDirective(Token directive) {
    checkOutsideDesignElement(directive);

    Token time;
    switch (peek().kind) {
        case TokenKind::IntegerLiteral:
        case TokenKind::RealLiteral:
            time = consume();
            break;
        case TokenKind::Identifier:
            if (peek().valueText() == "infinite")
                time = consume();
            break;
        default:
            break;
    }

    if (!time)
        time = expect(TokenKind::IntegerLiteral);

    auto result = alloc.emplace<DefaultDecayTimeDirectiveSyntax>(directive, time);
    return Trivia(TriviaKind::Directive, result);
}